

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
               (void)

{
  uint *__args_2;
  pointer puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  _Base_ptr p_Var4;
  Column_settings *pCVar5;
  bool bVar6;
  _Rb_tree_node_base *p_Var7;
  undefined1 *puVar8;
  witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>_>_>
  *witness;
  uint rowIndex;
  pointer __args;
  undefined4 local_5a4;
  undefined4 *local_5a0;
  _Base_ptr local_598;
  undefined **local_590;
  ulong local_588;
  shared_count sStack_580;
  undefined4 **local_578;
  undefined8 local_570;
  uint local_568 [2];
  undefined8 *local_560;
  _Base_ptr *local_558;
  undefined1 local_550 [8];
  undefined8 local_548;
  shared_count sStack_540;
  char *local_538;
  char *local_530;
  undefined **local_528;
  char *local_520;
  undefined8 *local_518;
  char *local_510;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
  m;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>>
            ();
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x30;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
              *)&m.matrix_,&columns,m.colSettings_);
  puVar1 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (columns.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5].
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    columns.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar1;
  }
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
            (&columns,&m);
  bars2._M_t._M_impl._0_8_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  build_longer_reduced_row_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>>
            ();
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  uVar2 = bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  bars1._M_t._M_impl._0_8_ = bars2._M_t._M_impl._0_8_;
  bars2._M_t._M_impl._0_8_ = bars3._M_t._M_impl._0_8_;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
  uVar3 = bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)uVar2;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = SUB84(uVar2,4);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
  bars3._M_t._M_impl._0_8_ = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = uVar3;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bars1);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bars3);
  uVar2 = bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  if (bars2._M_t._M_impl._0_8_ != bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_) {
    rowIndex = 0;
    witness = (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>_>_>
               *)bars2._M_t._M_impl._0_8_;
    do {
      get_ordered_row<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
                ((column_content<typename_Matrix<RU_rep_options_with_row_access<true,_(Column_types)7,_false,_true,_true,_true,_false,_true>_>::Column>
                  *)&bars1,&m,rowIndex);
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>>
                (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>_>_>
                          *)&bars1);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&bars1);
      witness = witness + 1;
      rowIndex = rowIndex + 1;
    } while (witness !=
             (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>_>_>
              *)uVar2);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bars2);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars1._M_t._M_impl.super__Rb_tree_header._M_header;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars2._M_t._M_impl.super__Rb_tree_header._M_header;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars3._M_t._M_impl.super__Rb_tree_header._M_header;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (m.matrix_.super_RU_pairing_option.barcode_.
      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      m.matrix_.super_RU_pairing_option.barcode_.
      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __args = m.matrix_.super_RU_pairing_option.barcode_.
             super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      __args_2 = &__args->death;
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars1,&__args->dim,&__args->birth,__args_2);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars2,&__args->dim,&__args->birth,__args_2);
      local_568[0] = *__args_2;
      local_570._0_4_ = __args->dim;
      local_570._4_4_ = __args->birth;
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int&,unsigned_int&,unsigned_int&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars3,(int *)&local_570,(uint *)((long)&local_570 + 4),local_568);
      __args = __args + 1;
    } while (__args != m.matrix_.super_RU_pairing_option.barcode_.
                       super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  p_Var4 = bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x574);
  local_520 = (char *)((ulong)local_520 & 0xffffffffffffff00);
  local_528 = &PTR__lazy_ostream_00240f68;
  local_518 = &boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_598 = (_Base_ptr)&p_Var4[1]._M_parent;
  local_5a0 = &local_5a4;
  local_5a4 = 0;
  local_550[0] = *(int *)&p_Var4[1]._M_parent == 0;
  local_548 = 0;
  sStack_540.pi_ = (sp_counted_base *)0x0;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_530 = "";
  local_558 = &local_598;
  local_568[0] = local_568[0] & 0xffffff00;
  local_570 = &PTR__lazy_ostream_00240f28;
  local_560 = &boost::unit_test::lazy_ostream::inst;
  local_588 = local_588 & 0xffffffffffffff00;
  local_578 = &local_5a0;
  local_590 = &PTR__lazy_ostream_00240f28;
  sStack_580.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_540);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x575);
  local_520 = (char *)((ulong)local_520 & 0xffffffffffffff00);
  local_528 = &PTR__lazy_ostream_00240f68;
  local_518 = &boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_5a4 = 0;
  local_550[0] = *(int *)&p_Var4[1].field_0x4 == 0;
  local_598 = (_Base_ptr)&p_Var4[1].field_0x4;
  local_548 = 0;
  sStack_540.pi_ = (sp_counted_base *)0x0;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_530 = "";
  local_568[0] = local_568[0] & 0xffffff00;
  local_570 = &PTR__lazy_ostream_00240f28;
  local_560 = &boost::unit_test::lazy_ostream::inst;
  local_558 = &local_598;
  local_5a0 = &local_5a4;
  local_588 = local_588 & 0xffffffffffffff00;
  local_590 = &PTR__lazy_ostream_00240f28;
  sStack_580.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_578 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_540);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x577);
  local_598 = p_Var4 + 1;
  local_520 = (char *)((ulong)local_520 & 0xffffffffffffff00);
  local_528 = &PTR__lazy_ostream_00240f68;
  local_518 = &boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_5a4 = 0xffffffff;
  local_550[0] = local_598->_M_color == ~_S_red;
  local_548 = 0;
  sStack_540.pi_ = (sp_counted_base *)0x0;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_530 = "";
  local_568[0] = local_568[0] & 0xffffff00;
  local_570 = &PTR__lazy_ostream_00240f28;
  local_560 = &boost::unit_test::lazy_ostream::inst;
  local_558 = &local_598;
  local_5a0 = &local_5a4;
  local_588 = local_588 & 0xffffffffffffff00;
  local_590 = &PTR__lazy_ostream_00240f28;
  sStack_580.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_578 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_540);
  p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x579);
  local_520 = (char *)((ulong)local_520 & 0xffffffffffffff00);
  local_528 = &PTR__lazy_ostream_00240f68;
  local_518 = &boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_5a4 = 0;
  local_550[0] = *(int *)&p_Var7[1]._M_parent == 0;
  local_598 = (_Base_ptr)&p_Var7[1]._M_parent;
  local_548 = 0;
  sStack_540.pi_ = (sp_counted_base *)0x0;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_530 = "";
  local_568[0] = local_568[0] & 0xffffff00;
  local_570 = &PTR__lazy_ostream_00240f28;
  local_560 = &boost::unit_test::lazy_ostream::inst;
  local_558 = &local_598;
  local_5a0 = &local_5a4;
  local_588 = local_588 & 0xffffffffffffff00;
  local_590 = &PTR__lazy_ostream_00240f28;
  sStack_580.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_578 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_540);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x57a);
  local_520 = (char *)((ulong)local_520 & 0xffffffffffffff00);
  local_528 = &PTR__lazy_ostream_00240f68;
  local_518 = &boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_5a4 = 1;
  local_550[0] = *(int *)&p_Var7[1].field_0x4 == 1;
  local_598 = (_Base_ptr)&p_Var7[1].field_0x4;
  local_548 = 0;
  sStack_540.pi_ = (sp_counted_base *)0x0;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_530 = "";
  local_568[0] = local_568[0] & 0xffffff00;
  local_570 = &PTR__lazy_ostream_00240f28;
  local_560 = &boost::unit_test::lazy_ostream::inst;
  local_558 = &local_598;
  local_5a0 = &local_5a4;
  local_588 = local_588 & 0xffffffffffffff00;
  local_590 = &PTR__lazy_ostream_00240f28;
  sStack_580.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_578 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_540);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a0,0x57b);
  local_598 = p_Var7 + 1;
  local_520 = (char *)((ulong)local_520 & 0xffffffffffffff00);
  local_528 = &PTR__lazy_ostream_00240f68;
  local_518 = &boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_5a4 = 3;
  local_550[0] = local_598->_M_color == 3;
  local_548 = 0;
  sStack_540.pi_ = (sp_counted_base *)0x0;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_530 = "";
  local_568[0] = local_568[0] & 0xffffff00;
  local_570 = &PTR__lazy_ostream_00240f28;
  local_560 = &boost::unit_test::lazy_ostream::inst;
  local_558 = &local_598;
  local_5a0 = &local_5a4;
  local_588 = local_588 & 0xffffffffffffff00;
  local_590 = &PTR__lazy_ostream_00240f28;
  sStack_580.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_578 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_540);
  p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2c0,0x57d);
  local_520 = (char *)((ulong)local_520 & 0xffffffffffffff00);
  local_528 = &PTR__lazy_ostream_00240f68;
  local_518 = &boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_5a4 = 0;
  local_550[0] = *(int *)&p_Var7[1]._M_parent == 0;
  local_598 = (_Base_ptr)&p_Var7[1]._M_parent;
  local_548 = 0;
  sStack_540.pi_ = (sp_counted_base *)0x0;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_530 = "";
  local_568[0] = local_568[0] & 0xffffff00;
  local_570 = &PTR__lazy_ostream_00240f28;
  local_560 = &boost::unit_test::lazy_ostream::inst;
  local_558 = &local_598;
  local_5a0 = &local_5a4;
  local_588 = local_588 & 0xffffffffffffff00;
  local_590 = &PTR__lazy_ostream_00240f28;
  sStack_580.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_578 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_540);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x57e);
  local_520 = (char *)((ulong)local_520 & 0xffffffffffffff00);
  local_528 = &PTR__lazy_ostream_00240f68;
  local_518 = &boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_5a4 = 2;
  local_550[0] = *(int *)&p_Var7[1].field_0x4 == 2;
  local_598 = (_Base_ptr)&p_Var7[1].field_0x4;
  local_548 = 0;
  sStack_540.pi_ = (sp_counted_base *)0x0;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_530 = "";
  local_568[0] = local_568[0] & 0xffffff00;
  local_570 = &PTR__lazy_ostream_00240f28;
  local_560 = &boost::unit_test::lazy_ostream::inst;
  local_558 = &local_598;
  local_5a0 = &local_5a4;
  local_588 = local_588 & 0xffffffffffffff00;
  local_590 = &PTR__lazy_ostream_00240f28;
  sStack_580.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_578 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_540);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_300,0x57f);
  local_598 = p_Var7 + 1;
  local_520 = (char *)((ulong)local_520 & 0xffffffffffffff00);
  local_528 = &PTR__lazy_ostream_00240f68;
  local_518 = &boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_5a4 = 4;
  local_550[0] = local_598->_M_color == 4;
  local_548 = 0;
  sStack_540.pi_ = (sp_counted_base *)0x0;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_530 = "";
  local_568[0] = local_568[0] & 0xffffff00;
  local_570 = &PTR__lazy_ostream_00240f28;
  local_560 = &boost::unit_test::lazy_ostream::inst;
  local_558 = &local_598;
  local_5a0 = &local_5a4;
  local_588 = local_588 & 0xffffffffffffff00;
  local_590 = &PTR__lazy_ostream_00240f28;
  sStack_580.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_578 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_540);
  p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_320,0x581);
  local_520 = (char *)((ulong)local_520 & 0xffffffffffffff00);
  local_528 = &PTR__lazy_ostream_00240f68;
  local_518 = &boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_5a4 = 0;
  local_550[0] = *(int *)&p_Var7[1]._M_parent == 0;
  local_598 = (_Base_ptr)&p_Var7[1]._M_parent;
  local_548 = 0;
  sStack_540.pi_ = (sp_counted_base *)0x0;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_530 = "";
  local_568[0] = local_568[0] & 0xffffff00;
  local_570 = &PTR__lazy_ostream_00240f28;
  local_560 = &boost::unit_test::lazy_ostream::inst;
  local_558 = &local_598;
  local_5a0 = &local_5a4;
  local_588 = local_588 & 0xffffffffffffff00;
  local_590 = &PTR__lazy_ostream_00240f28;
  sStack_580.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_578 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_540);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0x582);
  local_520 = (char *)((ulong)local_520 & 0xffffffffffffff00);
  local_528 = &PTR__lazy_ostream_00240f68;
  local_518 = &boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_5a4 = 7;
  local_550[0] = *(int *)&p_Var7[1].field_0x4 == 7;
  local_598 = (_Base_ptr)&p_Var7[1].field_0x4;
  local_548 = 0;
  sStack_540.pi_ = (sp_counted_base *)0x0;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_530 = "";
  local_568[0] = local_568[0] & 0xffffff00;
  local_570 = &PTR__lazy_ostream_00240f28;
  local_560 = &boost::unit_test::lazy_ostream::inst;
  local_558 = &local_598;
  local_5a0 = &local_5a4;
  local_588 = local_588 & 0xffffffffffffff00;
  local_590 = &PTR__lazy_ostream_00240f28;
  sStack_580.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_578 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_540);
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_360,0x583);
  local_598 = p_Var7 + 1;
  local_520 = (char *)((ulong)local_520 & 0xffffffffffffff00);
  local_528 = &PTR__lazy_ostream_00240f68;
  local_518 = &boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_5a4 = 8;
  local_550[0] = local_598->_M_color == 8;
  local_548 = 0;
  sStack_540.pi_ = (sp_counted_base *)0x0;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_530 = "";
  local_568[0] = local_568[0] & 0xffffff00;
  local_570 = &PTR__lazy_ostream_00240f28;
  local_560 = &boost::unit_test::lazy_ostream::inst;
  local_558 = &local_598;
  local_5a0 = &local_5a4;
  local_588 = local_588 & 0xffffffffffffff00;
  local_590 = &PTR__lazy_ostream_00240f28;
  sStack_580.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_578 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_540);
  p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_380,0x585);
  local_520 = (char *)((ulong)local_520 & 0xffffffffffffff00);
  local_528 = &PTR__lazy_ostream_00240f68;
  local_518 = &boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_5a4 = 1;
  local_550[0] = *(int *)&p_Var7[1]._M_parent == 1;
  local_598 = (_Base_ptr)&p_Var7[1]._M_parent;
  local_548 = 0;
  sStack_540.pi_ = (sp_counted_base *)0x0;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_530 = "";
  local_568[0] = local_568[0] & 0xffffff00;
  local_570 = &PTR__lazy_ostream_00240f28;
  local_560 = &boost::unit_test::lazy_ostream::inst;
  local_558 = &local_598;
  local_5a0 = &local_5a4;
  local_588 = local_588 & 0xffffffffffffff00;
  local_590 = &PTR__lazy_ostream_00240f28;
  sStack_580.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_578 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_540);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a0,0x586);
  local_520 = (char *)((ulong)local_520 & 0xffffffffffffff00);
  local_528 = &PTR__lazy_ostream_00240f68;
  local_518 = &boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_5a4 = 5;
  local_550[0] = *(int *)&p_Var7[1].field_0x4 == 5;
  local_598 = (_Base_ptr)&p_Var7[1].field_0x4;
  local_548 = 0;
  sStack_540.pi_ = (sp_counted_base *)0x0;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_530 = "";
  local_568[0] = local_568[0] & 0xffffff00;
  local_570 = &PTR__lazy_ostream_00240f28;
  local_560 = &boost::unit_test::lazy_ostream::inst;
  local_558 = &local_598;
  local_5a0 = &local_5a4;
  local_588 = local_588 & 0xffffffffffffff00;
  local_590 = &PTR__lazy_ostream_00240f28;
  sStack_580.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_578 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_540);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3c0,0x587);
  local_598 = p_Var7 + 1;
  local_520 = (char *)((ulong)local_520 & 0xffffffffffffff00);
  local_528 = &PTR__lazy_ostream_00240f68;
  local_518 = &boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_5a4 = 6;
  local_550[0] = local_598->_M_color == 6;
  local_548 = 0;
  sStack_540.pi_ = (sp_counted_base *)0x0;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_530 = "";
  local_568[0] = local_568[0] & 0xffffff00;
  local_570 = &PTR__lazy_ostream_00240f28;
  local_560 = &boost::unit_test::lazy_ostream::inst;
  local_558 = &local_598;
  local_5a0 = &local_5a4;
  local_588 = local_588 & 0xffffffffffffff00;
  local_590 = &PTR__lazy_ostream_00240f28;
  sStack_580.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_578 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion
            (local_550,&local_528,&local_538,0x587,1,2,2,"std::get<2>(*it)",&local_570,"6",
             &local_590);
  boost::detail::shared_count::~shared_count(&sStack_540);
  puVar8 = (undefined1 *)std::_Rb_tree_increment(p_Var7);
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3e0,0x589);
  local_590 = (undefined **)
              CONCAT71(local_590._1_7_,
                       (_Rb_tree_header *)puVar8 == &bars1._M_t._M_impl.super__Rb_tree_header);
  local_588 = 0;
  sStack_580.pi_ = (sp_counted_base *)0x0;
  local_528 = (undefined **)0x2041fc;
  local_520 = "";
  local_568[0] = local_568[0] & 0xffffff00;
  local_570 = &PTR__lazy_ostream_00241168;
  local_560 = &boost::unit_test::lazy_ostream::inst;
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3f8 = "";
  local_558 = (_Base_ptr *)&local_528;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_580);
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_410,0x58b);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars2._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar6 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar6 = false;
  }
  local_590 = (undefined **)CONCAT71(local_590._1_7_,bVar6);
  local_588 = 0;
  sStack_580.pi_ = (sp_counted_base *)0x0;
  local_528 = (undefined **)0x20420e;
  local_520 = "";
  local_568[0] = local_568[0] & 0xffffff00;
  local_570 = &PTR__lazy_ostream_00241168;
  local_560 = &boost::unit_test::lazy_ostream::inst;
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_428 = "";
  local_558 = (_Base_ptr *)&local_528;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_580);
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_438 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_440,0x58c);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars3._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar6 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar6 = false;
  }
  local_590 = (undefined **)CONCAT71(local_590._1_7_,bVar6);
  local_588 = 0;
  sStack_580.pi_ = (sp_counted_base *)0x0;
  local_528 = (undefined **)0x20421d;
  local_520 = "";
  local_568[0] = local_568[0] & 0xffffff00;
  local_570 = &PTR__lazy_ostream_00241168;
  local_560 = &boost::unit_test::lazy_ostream::inst;
  local_558 = (_Base_ptr *)&local_528;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_580);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars3._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars2._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars1._M_t);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>_>
  ::reset(&m.matrix_,m.colSettings_);
  pCVar5 = m.colSettings_;
  if (m.colSettings_ != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)m.colSettings_);
    operator_delete(pCVar5,0x38);
  }
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>_>
  ::~RU_matrix(&m.matrix_);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_barcode() {
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  const auto& barcode = m.get_current_barcode();

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    columns[5].clear();
  } else {
    columns = build_longer_chain_matrix<typename Matrix::Column>();
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::has_row_access) {
    std::vector<witness_content<typename Matrix::Column> > rows;
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      rows = build_longer_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_longer_chain_row_matrix<typename Matrix::Column>();
    }
    unsigned int i = 0;
    for (auto& r : rows) {
      if constexpr (Matrix::Option_list::has_removable_rows)
        if (i == 6) continue;
      test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
    }
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}